

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.cpp
# Opt level: O0

void __thiscall
Lodtalk::AST::PragmaDefinition::appendParameter(PragmaDefinition *this,string *keyword,Node *node)

{
  Node *local_20;
  Node *node_local;
  string *keyword_local;
  PragmaDefinition *this_local;
  
  local_20 = node;
  node_local = (Node *)keyword;
  keyword_local = (string *)this;
  std::__cxx11::string::operator+=((string *)&this->selector,(string *)keyword);
  std::vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>::push_back
            (&this->parameters,&local_20);
  return;
}

Assistant:

void PragmaDefinition::appendParameter(const std::string &keyword, Node *node)
{
    selector += keyword;
    parameters.push_back(node);
}